

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakP-1600-reference.c
# Opt level: O2

void KeccakP1600_DisplayRhoOffsets(FILE *f)

{
  ulong uVar1;
  ulong uVar2;
  uint *puVar3;
  
  puVar3 = KeccakRhoOffsets;
  for (uVar1 = 0; uVar1 != 5; uVar1 = uVar1 + 1) {
    for (uVar2 = 0; uVar2 != 5; uVar2 = uVar2 + 1) {
      fprintf((FILE *)f,"RhoOffset[%i][%i] = ",uVar2 & 0xffffffff,uVar1 & 0xffffffff);
      fprintf((FILE *)f,"%2i",(ulong)puVar3[uVar2]);
      fputc(10,(FILE *)f);
    }
    puVar3 = puVar3 + 5;
  }
  fputc(10,(FILE *)f);
  return;
}

Assistant:

void KeccakP1600_DisplayRhoOffsets(FILE *f)
{
    unsigned int x, y;

    for(y=0; y<5; y++) for(x=0; x<5; x++) {
        fprintf(f, "RhoOffset[%i][%i] = ", x, y);
        fprintf(f, "%2i", KeccakRhoOffsets[index(x, y)]);
        fprintf(f, "\n");
    }
    fprintf(f, "\n");
}